

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O0

int __thiscall CLayer::AddPenalty(CLayer *this,int iPenalty)

{
  CBoundary *this_00;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  int local_40;
  CBoundary *pBoundary;
  iterator end;
  iterator itr;
  int iMaxPenalty;
  int iPenalty_local;
  CLayer *this_local;
  
  itr._M_node._0_4_ = 0;
  end = std::
        multimap<int,_CBoundary_*,_std::less<int>,_std::allocator<std::pair<const_int,_CBoundary_*>_>_>
        ::begin(&this->m_CBoundaryBucket);
  pBoundary = (CBoundary *)
              std::
              multimap<int,_CBoundary_*,_std::less<int>,_std::allocator<std::pair<const_int,_CBoundary_*>_>_>
              ::end(&this->m_CBoundaryBucket);
  while( true ) {
    bVar1 = std::operator!=(&end,(_Self *)&pBoundary);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_CBoundary_*>_>::operator->(&end);
    this_00 = ppVar3->second;
    iVar2 = CBoundary::AddPenalty(this_00,iPenalty);
    if (iVar2 < (int)itr._M_node) {
      local_40 = (int)itr._M_node;
    }
    else {
      local_40 = CBoundary::AddPenalty(this_00,iPenalty);
    }
    itr._M_node._0_4_ = local_40;
    std::_Rb_tree_iterator<std::pair<const_int,_CBoundary_*>_>::operator++(&end);
  }
  return (int)itr._M_node;
}

Assistant:

int CLayer::AddPenalty(int iPenalty)
{
	int	iMaxPenalty	=	0;

	for(multimap<int, CBoundary*>::iterator itr=m_CBoundaryBucket.begin(),end=m_CBoundaryBucket.end();itr!=end;++itr)
	{
		CBoundary*	pBoundary	=	itr->second;

		iMaxPenalty	=	MAX(iMaxPenalty,pBoundary->AddPenalty(iPenalty));
	}
	return	iMaxPenalty;
}